

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::to_string<std::basic_string_view<char,std::char_traits<char>>,char[6]>
          (string *__return_storage_ptr__,lest *this,
          basic_string_view<char,_std::char_traits<char>_> *lhs,string *op,char (*rhs) [6])

{
  ostream *poVar1;
  basic_string_view<char,_std::char_traits<char>_> *value;
  char **txt;
  ostringstream os;
  string *local_1e0;
  string local_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  string_maker<std::basic_string_view<char,std::char_traits<char>>>::to_string_abi_cxx11_
            (&local_1b8,(string_maker<std::basic_string_view<char,std::char_traits<char>>> *)this,
             value);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  local_1e0 = op;
  to_string_abi_cxx11_(&local_1d8,(lest *)&local_1e0,txt);
  std::operator<<(poVar1,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}